

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<float_*,_10>::TPZManVector(TPZManVector<float_*,_10> *this,TPZVec<float_*> *copy)

{
  float **ppfVar1;
  ulong uVar2;
  ulong uVar3;
  
  (this->super_TPZVec<float_*>).fStore = (float **)0x0;
  (this->super_TPZVec<float_*>).fNElements = 0;
  (this->super_TPZVec<float_*>).fNAlloc = 0;
  (this->super_TPZVec<float_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0164fe68;
  uVar3 = copy->fNElements;
  if ((long)uVar3 < 0xb) {
    ppfVar1 = this->fExtAlloc;
    uVar2 = 0;
  }
  else {
    ppfVar1 = (float **)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    uVar2 = uVar3;
  }
  (this->super_TPZVec<float_*>).fStore = ppfVar1;
  (this->super_TPZVec<float_*>).fNElements = uVar3;
  (this->super_TPZVec<float_*>).fNAlloc = uVar2;
  uVar2 = 0;
  if ((long)uVar3 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    (this->super_TPZVec<float_*>).fStore[uVar2] = copy->fStore[uVar2];
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(
        const TPZVec<T> & copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= (int64_t) (sizeof (fExtAlloc) / sizeof (T))) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy[i];
    }
}